

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

xmlParserInputPtr xmlNoNetExternalEntityLoader(char *URL,char *ID,xmlParserCtxtPtr ctxt)

{
  uint uVar1;
  xmlParserInputPtr pxVar2;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    uVar1 = ctxt->options;
    ctxt->options = uVar1 | 0x800;
    pxVar2 = xmlDefaultExternalEntityLoader(URL,ID,ctxt);
    ctxt->options = uVar1;
    return pxVar2;
  }
  pxVar2 = xmlDefaultExternalEntityLoader(URL,ID,(xmlParserCtxtPtr)0x0);
  return pxVar2;
}

Assistant:

xmlParserInputPtr
xmlNoNetExternalEntityLoader(const char *URL, const char *ID,
                             xmlParserCtxtPtr ctxt) {
    int oldOptions = 0;
    xmlParserInputPtr input;

    if (ctxt != NULL) {
        oldOptions = ctxt->options;
        ctxt->options |= XML_PARSE_NONET;
    }

    input = xmlDefaultExternalEntityLoader(URL, ID, ctxt);

    if (ctxt != NULL)
        ctxt->options = oldOptions;

    return(input);
}